

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::initData(PeleLM *this)

{
  Geometry *a_level_geom;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pSVar3;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_01;
  Real *pRVar4;
  StateData *this_02;
  MultiFab *pMVar5;
  undefined1 auVar6 [16];
  int iVar7;
  Real RVar8;
  undefined1 auVar9 [16];
  undefined4 uVar10;
  ProbParm *pPVar11;
  DataContainer *pDVar12;
  undefined4 uVar13;
  _Alloc_hider _Var14;
  size_type sVar15;
  bool bVar16;
  __type _Var17;
  int iVar18;
  ostream *poVar19;
  long lVar20;
  MultiArray4<double> MVar21;
  int *piVar22;
  Array4<double> *pAVar23;
  int n_3;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  int i_4;
  int iVar29;
  int n;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  uint j_1;
  uint uVar41;
  long lVar42;
  ulong uVar43;
  int i_1;
  uint uVar44;
  double *pdVar45;
  long lVar46;
  int i_7;
  int iVar47;
  double *pdVar48;
  int iplt;
  uint uVar49;
  ulong uVar50;
  int i;
  ulong uVar51;
  long lVar52;
  double *pdVar53;
  double *pdVar54;
  long lVar55;
  Real *pRVar56;
  _func_int *p_Var57;
  double dVar58;
  Real RVar59;
  double dVar60;
  double dVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  _func_int **pp_Var67;
  int local_6f0;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  plotnames_1;
  string pltfile;
  string velocity_plotfile;
  Box local_5ac;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  plotnames;
  undefined1 local_578 [32];
  undefined8 local_558;
  double dStack_550;
  double local_548;
  double dStack_540;
  double local_538;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names_1;
  ulong uStack_510;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string local_4a0;
  string local_480;
  string firstChars;
  int local_438;
  Vector<int,_std::allocator<int>_> *local_410;
  Vector<int,_std::allocator<int>_> *local_408;
  PltFileManager pltData;
  ParmParse pp;
  MultiFab speciesPlt;
  
  pPVar11 = prob_parm_d;
  RVar59 = prob_parm->P_mean;
  RVar8 = prob_parm->T_mean;
  iVar18 = prob_parm->FlowDir;
  uVar10 = *(undefined4 *)&prob_parm->field_0x1c;
  prob_parm_d->MeanFlow = prob_parm->MeanFlow;
  pPVar11->FlowDir = iVar18;
  *(undefined4 *)&pPVar11->field_0x1c = uVar10;
  pPVar11->P_mean = RVar59;
  pPVar11->T_mean = RVar8;
  pSVar3 = (this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar3->new_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       pSVar3[1].new_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  std::__cxx11::string::string((string *)&firstChars,"peleLM",(allocator *)&speciesPlt);
  amrex::ParmParse::ParmParse(&pp,&firstChars);
  std::__cxx11::string::~string((string *)&firstChars);
  iVar18 = amrex::ParmParse::countval(&pp,"initDataPlt",-1);
  if (iVar18 < 1) {
    amrex::Geometry::data(&(this->super_NavierStokesBase).super_AmrLevel.geom);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0);
    pDVar12 = pmf_data.m_data_d;
    pPVar11 = prob_parm_d;
    MVar21 = amrex::FabArray<amrex::FArrayBox>::arrays<amrex::FArrayBox,_0>
                       ((FabArray<amrex::FArrayBox> *)
                        this_00.
                        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                        .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
    sVar15 = firstChars._M_string_length;
    _Var14 = firstChars._M_dataplus;
    local_5ac.smallend.vect[0] = 0;
    local_5ac.smallend.vect[1] = 0;
    local_5ac.smallend.vect[2] = 0;
    speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
         (_func_int **)
         CONCAT44(amrex::Gpu::Device::max_gpu_streams,
                  speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase.
                  _0_4_);
    speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ =
         amrex::FabArrayBase::mfiter_tile_size;
    speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
    m_typ.itype = (IndexType)(IndexType)DAT_006ddef0;
    speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
         (_func_int **)
         CONCAT53(speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase.
                  _3_5_,0x10001);
    amrex::MFIter::MFIter
              ((MFIter *)&pltData,
               (FabArrayBase *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(MFItInfo *)&speciesPlt)
    ;
    while (pltData.m_nvars <
           (int)pltData.m_vars.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
      amrex::MFIter::growntilebox((Box *)&pltfile,(MFIter *)&pltData,&local_5ac.smallend);
      uVar13 = pltfile.field_2._M_allocated_capacity._4_4_;
      uVar10 = pltfile.field_2._M_allocated_capacity._0_4_;
      piVar22 = &pltData.m_nvars;
      if (pltData._64_8_ != 0) {
        piVar22 = (int *)((long)pltData.m_nvars * 4 + *(long *)pltData._64_8_);
      }
      iVar18 = (int)pltfile._M_dataplus._M_p;
      iVar24 = pltfile._M_string_length._4_4_;
      lVar30 = (long)pltfile._M_dataplus._M_p._4_4_;
      pAVar23 = MVar21.hp + *piVar22;
      for (lVar52 = (long)(int)pltfile._M_string_length; lVar20 = lVar30, (int)lVar52 <= (int)uVar13
          ; lVar52 = lVar52 + 1) {
        for (; iVar29 = (int)lVar20, iVar29 <= (int)uVar10; lVar20 = lVar20 + 1) {
          if (iVar18 <= iVar24) {
            iVar7 = iVar18;
            do {
              dVar58 = ((double)iVar7 + 0.5) * (double)local_410 + (double)_Var14._M_p;
              speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_ref.
              super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_ref.
              super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
              _52_8_ = 0;
              speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
              _60_8_ = 0;
              speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
              _36_8_ = 0;
              speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
              _44_8_ = 0;
              speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
              _20_8_ = 0;
              speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
              _28_8_ = 0;
              speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
              _4_8_ = 0;
              speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
              _12_8_ = 0;
              speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
              m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
                   (_func_int **)0x0;
              speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ =
                   0;
              dVar61 = 0.0;
              if ((0.0015 < dVar58) && (dVar58 < 0.08)) {
                dVar58 = tanh(((dVar58 + 0.008) * -0.2125565616700221 +
                              ABS(((double)iVar29 + 0.5) * (double)local_408 + (double)sVar15)) /
                              0.012);
                dVar61 = (1.0 - dVar58) * 0.5 + 2.5;
              }
              if (pDVar12->m_doAverage == 0) {
                dVar58 = (dVar61 + dVar61) * 0.5;
                pdVar53 = pDVar12->pmf_X;
                uVar2 = pDVar12->m_nPoint;
                uVar51 = (ulong)(uVar2 - 1);
                uVar50 = (ulong)-(uint)(*pdVar53 <= dVar58);
                if (pdVar53[uVar51] <= dVar58 && dVar58 != pdVar53[uVar51]) {
                  uVar50 = uVar51;
                }
                uVar27 = (uint)uVar50;
                if (uVar27 == 0xffffffff) {
                  uVar34 = 0xffffffffffffffff;
                  uVar50 = 0xffffffff;
                  uVar33 = 0;
                  while (uVar27 = (uint)uVar34, uVar51 != uVar33) {
                    if ((dVar58 < pdVar53[uVar33]) || (pdVar53[uVar33 + 1] < dVar58)) {
                      uVar33 = uVar33 + 1;
                    }
                    else {
                      uVar34 = uVar33 + 1;
                      uVar50 = uVar33 & 0xffffffff;
                      uVar33 = uVar34;
                    }
                  }
                }
                uVar49 = pDVar12->m_nVar;
                uVar28 = (uint)uVar50;
                uVar44 = uVar27;
                for (uVar41 = 0; uVar49 != uVar41; uVar41 = uVar41 + 1) {
                  dVar58 = pDVar12->pmf_Y[uVar50];
                  dVar60 = 0.0;
                  if (uVar28 != uVar27) {
                    dVar60 = (pDVar12->pmf_Y[uVar44] - dVar58) /
                             (pdVar53[(int)uVar27] - pdVar53[(int)uVar28]);
                  }
                  (&speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                    _vptr_FabArrayBase)[(int)uVar41] =
                       (_func_int **)((dVar61 - pdVar53[(int)uVar28]) * dVar60 + dVar58);
                  uVar44 = uVar44 + uVar2;
                  uVar50 = (ulong)((int)uVar50 + uVar2);
                }
              }
              else {
                pdVar53 = pDVar12->pmf_X;
                uVar2 = pDVar12->m_nPoint;
                uVar51 = (ulong)(uVar2 - 1);
                uVar50 = (ulong)-(uint)(*pdVar53 <= dVar61);
                if (pdVar53[uVar51] <= dVar61 && dVar61 != pdVar53[uVar51]) {
                  uVar50 = uVar51;
                }
                iVar25 = (int)uVar50;
                iVar35 = iVar25;
                iVar38 = iVar25;
                if (iVar25 == -1) {
                  uVar50 = 0xffffffffffffffff;
                  uVar33 = 0xffffffff;
                  uVar34 = 0;
                  while (iVar25 = (int)uVar33, uVar51 != uVar34) {
                    if ((dVar61 < pdVar53[uVar34]) || (pdVar53[uVar34 + 1] < dVar61)) {
                      uVar34 = uVar34 + 1;
                    }
                    else {
                      uVar50 = uVar34 + 1;
                      uVar33 = uVar34 & 0xffffffff;
                      uVar34 = uVar50;
                    }
                  }
                  uVar33 = 0xffffffffffffffff;
                  uVar34 = 0xffffffff;
                  uVar43 = 0;
                  while( true ) {
                    iVar38 = (int)uVar33;
                    iVar35 = (int)uVar34;
                    if (uVar51 == uVar43) break;
                    if ((dVar61 < pdVar53[uVar43]) || (pdVar53[uVar43 + 1] < dVar61)) {
                      uVar43 = uVar43 + 1;
                    }
                    else {
                      uVar34 = uVar43 + 1;
                      uVar33 = uVar43 & 0xffffffff;
                      uVar43 = uVar34;
                    }
                  }
                }
                uVar27 = pDVar12->m_nVar;
                iVar26 = (int)uVar50;
                for (uVar49 = 0; uVar49 != uVar27; uVar49 = uVar49 + 1) {
                  iVar47 = uVar49 * uVar2;
                  pRVar4 = pDVar12->pmf_Y;
                  dVar58 = pdVar53[iVar26];
                  uVar62 = SUB84(dVar58,0);
                  uVar63 = (undefined4)((ulong)dVar58 >> 0x20);
                  dVar60 = 0.0;
                  if (iVar25 != iVar26) {
                    dVar60 = (pRVar4[(uint)(iVar47 + iVar26)] - pRVar4[(uint)(iVar47 + iVar25)]) /
                             (dVar58 - pdVar53[iVar25]);
                  }
                  dVar60 = (dVar61 - pdVar53[iVar25]) * dVar60 + pRVar4[(uint)(iVar47 + iVar25)];
                  if (iVar25 == iVar38) {
                    pp_Var67 = (_func_int **)((dVar60 + dVar60) * 0.5);
                  }
                  else {
                    dVar64 = pRVar4[(uint)(iVar47 + iVar38)];
                    dVar66 = 0.0;
                    if (iVar38 != iVar35) {
                      dVar66 = (pRVar4[(uint)(iVar47 + iVar35)] - dVar64) /
                               (pdVar53[iVar35] - pdVar53[iVar38]);
                    }
                    dVar65 = dVar61 - pdVar53[iVar38];
                    dVar58 = (dVar66 * dVar65 + dVar64 + dVar64) * dVar65 * 0.5 +
                             (dVar58 - dVar61) * 0.5 * (pRVar4[(uint)(iVar47 + iVar26)] + dVar60);
                    uVar51 = uVar50 & 0xffffffff;
                    for (lVar39 = (long)iVar26; lVar39 < iVar38; lVar39 = lVar39 + 1) {
                      dVar60 = pdVar53[lVar39 + 1];
                      pdVar54 = pRVar4 + uVar51;
                      uVar51 = (ulong)((int)uVar51 + 1);
                      dVar58 = dVar58 + (*pdVar54 + pRVar4[uVar51]) *
                                        (dVar60 - (double)CONCAT44(uVar63,uVar62)) * 0.5;
                      uVar62 = SUB84(dVar60,0);
                      uVar63 = (undefined4)((ulong)dVar60 >> 0x20);
                    }
                    pp_Var67 = (_func_int **)(dVar58 / (dVar61 - dVar61));
                  }
                  (&speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                    _vptr_FabArrayBase)[(int)uVar49] = pp_Var67;
                  uVar50 = (ulong)((int)uVar50 + uVar2);
                }
              }
              local_548 = 0.0;
              dStack_540 = 0.0;
              local_558 = 0.0;
              dStack_550 = 0.0;
              local_578._16_8_ = 0.0;
              local_578._24_8_ = 0.0;
              local_578._0_8_ = (_func_int **)0x0;
              local_578._8_8_ = 0.0;
              local_538 = 0.0;
              for (lVar39 = 0; lVar39 != 9; lVar39 = lVar39 + 1) {
                *(undefined8 *)(local_578 + lVar39 * 8) =
                     *(undefined8 *)
                      ((long)&speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                              boxarray.m_bat.m_op + lVar39 * 8 + 0xc);
              }
              dVar61 = 1.0 / (dStack_540 * 34.014 +
                              local_548 * 33.006 +
                              dStack_550 * 17.007 +
                              local_558 * 15.999 +
                              (double)local_578._24_8_ * 1.008 +
                              (double)local_578._16_8_ * 18.015 +
                              (double)local_578._8_8_ * 31.998 +
                              (double)local_578._0_8_ * 2.016 + 0.0 + local_538 * 28.014);
              names_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((double)local_578._0_8_ * 2.016 * dVar61);
              dVar58 = (double)local_578._8_8_ * 31.998 * dVar61;
              auVar6._8_4_ = SUB84(dVar58,0);
              auVar6._0_8_ = names_1.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              auVar6._12_4_ = (int)((ulong)dVar58 >> 0x20);
              names_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar6._8_8_;
              dVar58 = (double)local_578._24_8_ * 1.008 * dVar61;
              unique0x1000078c = SUB84(dVar58,0);
              names_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (double)local_578._16_8_ * 18.015 * dVar61;
              unique0x10000790 = (int)((ulong)dVar58 >> 0x20);
              pdVar53 = pAVar23->p;
              lVar39 = pAVar23->jstride;
              lVar37 = (long)(pAVar23->begin).x;
              lVar32 = iVar7 - lVar37;
              lVar40 = (long)(pAVar23->begin).y;
              lVar42 = (iVar29 - lVar40) * lVar39;
              lVar46 = (long)(pAVar23->begin).z;
              lVar36 = pAVar23->kstride;
              lVar55 = ((int)lVar52 - lVar46) * lVar36;
              lVar31 = pAVar23->nstride;
              pRVar4 = pdVar53 + lVar42 + lVar32 + lVar55;
              pRVar4[lVar31 * 0xe] =
                   (Real)speciesPlt.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                         _vptr_FabArrayBase;
              pdVar53[lVar42 + lVar32 + lVar55] = 0.0;
              pRVar4[lVar31] = 0.0;
              pRVar4[lVar31 * 2] = 0.0;
              iVar35 = pPVar11->FlowDir;
              pRVar56 = pRVar4;
              if (iVar35 == 0) {
LAB_00187e0e:
                *pRVar56 = pPVar11->MeanFlow;
              }
              else {
                if (iVar35 == 1) {
                  pRVar56 = pRVar4 + lVar31;
                  goto LAB_00187e0e;
                }
                if (iVar35 == 2) {
                  pRVar56 = pRVar4 + lVar31 * 2;
                  goto LAB_00187e0e;
                }
              }
              dVar58 = pPVar11->P_mean;
              dVar61 = pRVar4[lVar31 * 0xe];
              plotnames_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fdfbefbefbefbf0;
              plotnames_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3fa000418a43bf8c;
              plotnames_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3fac6bb6f569cbd9;
              for (lVar42 = 0; lVar42 != 9; lVar42 = lVar42 + 1) {
                (&velocity_plotfile._M_dataplus)[lVar42]._M_p =
                     (pointer)((double)(&names_1.
                                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)[lVar42] *
                              (double)(&plotnames_1.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)[lVar42]);
              }
              dVar60 = 0.0;
              for (lVar42 = 0; lVar42 != 9; lVar42 = lVar42 + 1) {
                dVar60 = dVar60 + (double)(&velocity_plotfile._M_dataplus)[lVar42]._M_p;
              }
              pRVar4[lVar31 * 3] = ((dVar58 * 10.0) / (dVar61 * 83144626.1815324 * dVar60)) * 1000.0
              ;
              dVar58 = pRVar4[lVar31 * 0xe];
              dVar66 = dVar58 * dVar58;
              dVar64 = dVar58 * dVar66;
              dVar61 = dVar58 * dVar64;
              velocity_plotfile._M_dataplus._M_p = (pointer)0x3fdfbefbefbefbf0;
              velocity_plotfile._M_string_length = 0x3fa000418a43bf8c;
              velocity_plotfile.field_2._M_allocated_capacity = 0x3fac6bb6f569cbd9;
              velocity_plotfile.field_2._8_8_ = 0x3fefbefbefbefbf0;
              dVar60 = 1.0 / dVar58;
              if (1000.0 <= dVar58) {
                plotnames_1.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)(dVar60 * -835.033997 +
                              dVar61 * 3.16550358e-16 +
                              dVar64 * -2.30789455e-12 +
                              dVar66 * -1.8779429e-08 + dVar58 * 0.000350032206 + 2.99142337);
                plotnames_1.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)(dVar60 * -1233.93018 +
                              dVar61 * -2.27287062e-16 +
                              dVar64 * 4.4382037e-12 +
                              dVar66 * -4.19613997e-08 + dVar58 * 0.000306759845 + 3.69757819);
                dVar64 = dVar61 * -1.27832357e-15 +
                         dVar64 * 3.00249098e-11 +
                         dVar66 * -2.9100867e-07 + dVar58 * 0.00152814644 + 2.67214561;
                dVar61 = -29899.209;
              }
              else {
                plotnames_1.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)(dVar60 * -1012.52087 +
                              dVar61 * 8.26974448e-14 +
                              dVar64 * -2.36885858e-11 +
                              dVar66 * -2.71433843e-07 + dVar58 * 0.000412472087 + 3.29812431);
                plotnames_1.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)(dVar60 * -1005.24902 +
                              dVar61 * -1.75371078e-13 +
                              dVar64 * 3.28469308e-10 +
                              dVar66 * -1.91871682e-07 + dVar58 * 0.000563743175 + 3.2129364);
                dVar64 = dVar61 * -5.01317694e-13 +
                         dVar64 * 1.74214532e-09 +
                         dVar66 * -2.11823211e-06 + dVar58 * 0.00173749123 + 3.38684249;
                dVar61 = -30208.1133;
              }
              plotnames_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)(dVar60 * dVar61 + dVar64);
              for (lVar42 = 0; lVar42 != 9; lVar42 = lVar42 + 1) {
                (&plotnames_1.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)[lVar42] =
                     (pointer)((double)(&velocity_plotfile._M_dataplus)[lVar42]._M_p *
                               dVar58 * 83144626.1815324 *
                              (double)(&plotnames_1.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)[lVar42]);
              }
              dVar58 = 0.0;
              for (lVar42 = 0; lVar42 != 9; lVar42 = lVar42 + 1) {
                dVar58 = dVar58 + (double)(&names_1.
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)[lVar42] *
                                  (double)(&plotnames_1.
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)[lVar42];
              }
              pRVar4[lVar31 * 0xd] = dVar58;
              pRVar4[lVar31 * 0xd] = dVar58 * 0.0001 * pRVar4[lVar31 * 3];
              pdVar53 = pdVar53 + ((lVar36 * (lVar52 - lVar46) +
                                   lVar39 * (lVar20 - lVar40) + (long)iVar7 + lVar31 * 4) - lVar37);
              for (lVar39 = 0; lVar39 != 9; lVar39 = lVar39 + 1) {
                *pdVar53 = (double)(&names_1.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)[lVar39] *
                           pRVar4[lVar31 * 3];
                pdVar53 = pdVar53 + lVar31;
              }
              bVar16 = iVar7 != iVar24;
              iVar7 = iVar7 + 1;
            } while (bVar16);
          }
        }
      }
      amrex::MFIter::operator++((MFIter *)&pltData);
    }
    amrex::MFIter::~MFIter((MFIter *)&pltData);
  }
  else {
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0);
    pltfile._M_dataplus._M_p = (pointer)&pltfile.field_2;
    pltfile._M_string_length = 0;
    pltfile.field_2._M_allocated_capacity._0_4_ =
         pltfile.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    amrex::ParmParse::query(&pp,"initDataPlt",&pltfile,0);
    if (NavierStokesBase::verbose != 0) {
      poVar19 = amrex::OutStream();
      amrex::Print::Print((Print *)&firstChars,poVar19);
      paVar1 = &firstChars.field_2;
      std::operator<<((ostream *)paVar1->_M_local_buf,"initData: reading data from: ");
      std::operator<<((ostream *)paVar1->_M_local_buf,(string *)&pltfile);
      std::operator<<((ostream *)paVar1->_M_local_buf,'\n');
      amrex::Print::~Print((Print *)&firstChars);
    }
    std::__cxx11::string::string((string *)&local_480,(string *)&pltfile);
    pele::physics::pltfilemanager::PltFileManager::PltFileManager(&pltData,&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&plotnames.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ,&pltData.m_vars.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pele::physics::eos::speciesNames<pele::physics::eos::Fuego>(&names);
    iVar18 = -1;
    lVar30 = 0;
    uVar2 = 0;
    local_6f0 = -1;
    uVar50 = 0xffffffff;
    for (uVar51 = 0;
        (long)uVar51 <
        (long)plotnames.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)plotnames.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5; uVar51 = uVar51 + 1) {
      std::__cxx11::string::substr
                ((ulong)&firstChars,
                 (long)&((plotnames.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar30);
      bVar16 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&((plotnames.
                                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar30),"temp");
      if (bVar16) {
        uVar50 = uVar51 & 0xffffffff;
      }
      bVar16 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&((plotnames.
                                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar30),"x_velocity");
      if (bVar16) {
        local_6f0 = (int)uVar51;
      }
      bVar16 = std::operator==(&firstChars,"Y(");
      uVar2 = uVar2 + bVar16;
      bVar16 = std::operator==(&firstChars,"Y(");
      iVar24 = iVar18;
      if (iVar18 < 0) {
        iVar24 = (int)uVar51;
      }
      if (bVar16) {
        iVar18 = iVar24;
      }
      std::__cxx11::string::~string((string *)&firstChars);
      lVar30 = lVar30 + 0x20;
    }
    a_level_geom = &(this->super_NavierStokesBase).super_AmrLevel.geom;
    pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
              (&pltData,(this->super_NavierStokesBase).super_AmrLevel.level,a_level_geom,local_6f0,0
               ,3,(MultiFab *)
                  this_00.
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
    pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
              (&pltData,(this->super_NavierStokesBase).super_AmrLevel.level,a_level_geom,(int)uVar50
               ,NavierStokesBase::Temp,1,
               (MultiFab *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
    firstChars._M_dataplus._M_p = (pointer)0x1;
    firstChars._M_string_length = 0;
    firstChars.field_2._M_allocated_capacity = 0;
    firstChars.field_2._8_8_ = 0;
    velocity_plotfile._M_dataplus._M_p = (pointer)&PTR__FabFactory_006d8928;
    amrex::MultiFab::MultiFab
              (&speciesPlt,&(this->super_NavierStokesBase).super_AmrLevel.grids,
               &(this->super_NavierStokesBase).super_AmrLevel.dmap,uVar2,0,(MFInfo *)&firstChars,
               (FabFactory<amrex::FArrayBox> *)&velocity_plotfile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&firstChars.field_2);
    pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
              (&pltData,(this->super_NavierStokesBase).super_AmrLevel.level,a_level_geom,
               local_6f0 + 3,0,uVar2,&speciesPlt);
    for (lVar30 = 0; lVar30 != 9; lVar30 = lVar30 + 1) {
      std::operator+(&velocity_plotfile,"Y(",
                     spec_names_abi_cxx11_.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar30);
      std::operator+(&firstChars,&velocity_plotfile,")");
      std::__cxx11::string::~string((string *)&velocity_plotfile);
      iVar24 = (int)lVar30 + 4;
      bVar16 = false;
      lVar52 = (long)iVar18 << 5;
      for (uVar50 = 0; uVar2 != uVar50; uVar50 = uVar50 + 1) {
        _Var17 = std::operator==(&firstChars,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&((plotnames.
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar52));
        if (_Var17) {
          bVar16 = true;
          amrex::MultiFab::Copy
                    ((MultiFab *)
                     this_00.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&speciesPlt,
                     (int)uVar50,iVar24,1,0);
        }
        lVar52 = lVar52 + 0x20;
      }
      if (!bVar16) {
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   this_00.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,iVar24,1,0);
      }
      std::__cxx11::string::~string((string *)&firstChars);
    }
    if (NavierStokesBase::verbose != 0) {
      poVar19 = amrex::OutStream();
      amrex::Print::Print((Print *)&firstChars,poVar19);
      std::operator<<((ostream *)firstChars.field_2._M_local_buf,
                      "initData: finished init from pltfile");
      std::operator<<((ostream *)firstChars.field_2._M_local_buf,'\n');
      amrex::Print::~Print((Print *)&firstChars);
    }
    amrex::MFIter::MFIter
              ((MFIter *)&firstChars,
               (FabArrayBase *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
    while (0 < local_438) {
      amrex::MFIter::tilebox(&local_5ac,(MFIter *)&firstChars);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_578,
                 (FabArray<amrex::FArrayBox> *)
                 this_00.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(MFIter *)&firstChars)
      ;
      pPVar11 = prob_parm_d;
      lVar30 = (long)local_5ac.smallend.vect[2];
      pdVar53 = (double *)
                (local_578._24_8_ * 0x20 +
                 (lVar30 - dStack_550._0_4_) * local_578._16_8_ * 8 +
                 ((long)local_5ac.smallend.vect[1] - (long)local_558._4_4_) * local_578._8_8_ * 8 +
                 (long)local_5ac.smallend.vect[0] * 8 + (long)(int)local_558 * -8 + local_578._0_8_)
      ;
      for (; lVar30 <= local_5ac.bigend.vect[2]; lVar30 = lVar30 + 1) {
        lVar20 = (lVar30 - dStack_550._0_4_) * local_578._16_8_;
        pdVar54 = pdVar53;
        for (lVar52 = (long)local_5ac.smallend.vect[1]; lVar52 <= local_5ac.bigend.vect[1];
            lVar52 = lVar52 + 1) {
          if (local_5ac.smallend.vect[0] <= local_5ac.bigend.vect[0]) {
            lVar36 = (lVar52 - local_558._4_4_) * local_578._8_8_;
            lVar39 = (long)local_5ac.smallend.vect[0];
            pdVar48 = pdVar54;
            do {
              stack0xfffffffffffffae8 = ZEXT816(0);
              names_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
              lVar42 = lVar39 - (int)local_558;
              pdVar45 = pdVar48;
              for (lVar31 = 0; lVar31 != 9; lVar31 = lVar31 + 1) {
                (&names_1.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)[lVar31] = (pointer)*pdVar45;
                pdVar45 = pdVar45 + local_578._24_8_;
              }
              dVar58 = pPVar11->P_mean;
              p_Var57 = *(_func_int **)
                         (local_578._0_8_ + (lVar20 + lVar36 + lVar42 + local_578._24_8_ * 0xe) * 8)
              ;
              plotnames_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fdfbefbefbefbf0;
              plotnames_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3fa000418a43bf8c;
              plotnames_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3fac6bb6f569cbd9;
              for (lVar31 = 0; lVar31 != 9; lVar31 = lVar31 + 1) {
                (&velocity_plotfile._M_dataplus)[lVar31]._M_p =
                     (pointer)((double)(&names_1.
                                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)[lVar31] *
                              (double)(&plotnames_1.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)[lVar31]);
              }
              dVar61 = 0.0;
              for (lVar31 = 0; lVar31 != 9; lVar31 = lVar31 + 1) {
                dVar61 = dVar61 + (double)(&velocity_plotfile._M_dataplus)[lVar31]._M_p;
              }
              *(_func_int **)
               (local_578._0_8_ + (lVar20 + lVar36 + lVar42 + local_578._24_8_ * 3) * 8) =
                   (_func_int *)
                   (((dVar58 * 10.0) / ((double)p_Var57 * 83144626.1815324 * dVar61)) * 1000.0);
              p_Var57 = *(_func_int **)
                         (local_578._0_8_ + (lVar20 + lVar36 + lVar42 + local_578._24_8_ * 0xe) * 8)
              ;
              dVar64 = (double)p_Var57 * (double)p_Var57;
              dVar60 = (double)p_Var57 * dVar64;
              dVar58 = (double)p_Var57 * dVar60;
              velocity_plotfile._M_dataplus._M_p = (pointer)0x3fdfbefbefbefbf0;
              velocity_plotfile._M_string_length = 0x3fa000418a43bf8c;
              velocity_plotfile.field_2._M_allocated_capacity = 0x3fac6bb6f569cbd9;
              velocity_plotfile.field_2._8_8_ = 0x3fefbefbefbefbf0;
              dVar61 = 1.0 / (double)p_Var57;
              if (1000.0 <= (double)p_Var57) {
                plotnames_1.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)(dVar61 * -835.033997 +
                              dVar58 * 3.16550358e-16 +
                              dVar60 * -2.30789455e-12 +
                              dVar64 * -1.8779429e-08 +
                              (double)p_Var57 * 0.000350032206 + 2.99142337);
                plotnames_1.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)(dVar61 * -1233.93018 +
                              dVar58 * -2.27287062e-16 +
                              dVar60 * 4.4382037e-12 +
                              dVar64 * -4.19613997e-08 +
                              (double)p_Var57 * 0.000306759845 + 3.69757819);
                dVar60 = dVar58 * -1.27832357e-15 +
                         dVar60 * 3.00249098e-11 +
                         dVar64 * -2.9100867e-07 + (double)p_Var57 * 0.00152814644 + 2.67214561;
                dVar58 = -29899.209;
              }
              else {
                plotnames_1.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)(dVar61 * -1012.52087 +
                              dVar58 * 8.26974448e-14 +
                              dVar60 * -2.36885858e-11 +
                              dVar64 * -2.71433843e-07 +
                              (double)p_Var57 * 0.000412472087 + 3.29812431);
                plotnames_1.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)(dVar61 * -1005.24902 +
                              dVar58 * -1.75371078e-13 +
                              dVar60 * 3.28469308e-10 +
                              dVar64 * -1.91871682e-07 +
                              (double)p_Var57 * 0.000563743175 + 3.2129364);
                dVar60 = dVar58 * -5.01317694e-13 +
                         dVar60 * 1.74214532e-09 +
                         dVar64 * -2.11823211e-06 + (double)p_Var57 * 0.00173749123 + 3.38684249;
                dVar58 = -30208.1133;
              }
              plotnames_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)(dVar61 * dVar58 + dVar60);
              for (lVar31 = 0; lVar31 != 9; lVar31 = lVar31 + 1) {
                (&plotnames_1.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)[lVar31] =
                     (pointer)((double)(&velocity_plotfile._M_dataplus)[lVar31]._M_p *
                               (double)p_Var57 * 83144626.1815324 *
                              (double)(&plotnames_1.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)[lVar31]);
              }
              p_Var57 = (_func_int *)0x0;
              for (lVar31 = 0; lVar31 != 9; lVar31 = lVar31 + 1) {
                p_Var57 = (_func_int *)
                          ((double)p_Var57 +
                          (double)(&names_1.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)[lVar31] *
                          (double)(&plotnames_1.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)[lVar31]);
              }
              *(_func_int **)
               (local_578._0_8_ + (lVar20 + lVar36 + lVar42 + local_578._24_8_ * 0xd) * 8) = p_Var57
              ;
              *(_func_int **)
               (local_578._0_8_ + (lVar20 + lVar36 + lVar42 + local_578._24_8_ * 0xd) * 8) =
                   (_func_int *)
                   ((double)p_Var57 * 0.0001 *
                   (double)*(_func_int **)
                            (local_578._0_8_ + (lVar20 + lVar36 + lVar42 + local_578._24_8_ * 3) * 8
                            ));
              pdVar45 = pdVar48;
              for (lVar31 = 0; lVar31 != 9; lVar31 = lVar31 + 1) {
                *pdVar45 = (double)(&names_1.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)[lVar31] *
                           (double)*(_func_int **)
                                    (local_578._0_8_ +
                                    (lVar20 + lVar36 + lVar42 + local_578._24_8_ * 3) * 8);
                pdVar45 = pdVar45 + local_578._24_8_;
              }
              lVar39 = lVar39 + 1;
              pdVar48 = pdVar48 + 1;
            } while (local_5ac.bigend.vect[0] + 1 != (int)lVar39);
          }
          pdVar54 = pdVar54 + local_578._8_8_;
        }
        pdVar53 = pdVar53 + local_578._16_8_;
      }
      amrex::MFIter::operator++((MFIter *)&firstChars);
    }
    amrex::MFIter::~MFIter((MFIter *)&firstChars);
    amrex::MultiFab::~MultiFab(&speciesPlt);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&names.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&plotnames.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    pele::physics::pltfilemanager::PltFileManager::~PltFileManager(&pltData);
    std::__cxx11::string::~string((string *)&pltfile);
  }
  std::__cxx11::string::string((string *)&firstChars,"1D",(allocator *)&pltData);
  std::__cxx11::string::string((string *)&speciesPlt,"1D_S",(allocator *)&velocity_plotfile);
  uVar50 = 0xffffffffffffffff;
  showMFsub(&firstChars,
            (MultiFab *)
            this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
            _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&stripBox,
            (string *)&speciesPlt,(this->super_NavierStokesBase).super_AmrLevel.level,-1);
  std::__cxx11::string::~string((string *)&speciesPlt);
  std::__cxx11::string::~string((string *)&firstChars);
  RVar59 = amrex::StateData::curTime
                     ((this->super_NavierStokesBase).super_AmrLevel.state.
                      super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1);
  NavierStokesBase::computeGradP(&this->super_NavierStokesBase,RVar59);
  velocity_plotfile._M_dataplus._M_p = (pointer)&velocity_plotfile.field_2;
  velocity_plotfile._M_string_length = 0;
  velocity_plotfile.field_2._M_allocated_capacity =
       velocity_plotfile.field_2._M_allocated_capacity & 0xffffffffffffff00;
  amrex::ParmParse::query(&pp,"initVelocityPlt",&velocity_plotfile,0);
  if (velocity_plotfile._M_string_length != 0) {
    if (NavierStokesBase::verbose != 0) {
      poVar19 = amrex::OutStream();
      amrex::Print::Print((Print *)&firstChars,poVar19);
      paVar1 = &firstChars.field_2;
      std::operator<<((ostream *)paVar1->_M_local_buf,"initData: reading velocity from: ");
      std::operator<<((ostream *)paVar1->_M_local_buf,(string *)&velocity_plotfile);
      std::operator<<((ostream *)paVar1->_M_local_buf,'\n');
      amrex::Print::~Print((Print *)&firstChars);
    }
    std::__cxx11::string::string((string *)&local_4a0,(string *)&velocity_plotfile);
    pele::physics::pltfilemanager::PltFileManager::PltFileManager(&pltData,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&plotnames_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ,&pltData.m_vars.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    names_1.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uStack_510;
    stack0xfffffffffffffae8 = auVar9 << 0x40;
    pele::physics::eos::speciesNames<pele::physics::eos::Fuego>(&names_1);
    lVar30 = 0;
    for (uVar51 = 0;
        (long)uVar51 <
        (long)plotnames_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)plotnames_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5; uVar51 = uVar51 + 1) {
      bVar16 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&((plotnames_1.
                                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar30),"x_velocity");
      if (bVar16) {
        uVar50 = uVar51;
      }
      uVar50 = uVar50 & 0xffffffff;
      lVar30 = lVar30 + 0x20;
    }
    if ((int)uVar50 == -1) {
      amrex::Abort_host("Could not find velocity fields in supplied peleLM.initVelocityPlt");
    }
    firstChars._M_dataplus._M_p = (pointer)0x1;
    firstChars._M_string_length = 0;
    firstChars.field_2._M_allocated_capacity = 0;
    firstChars.field_2._8_8_ = 0;
    local_578._0_8_ = &PTR__FabFactory_006d8928;
    amrex::MultiFab::MultiFab
              (&speciesPlt,
               (BoxArray *)
               ((long)this_00.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8),
               (DistributionMapping *)
               ((long)this_00.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0x70),1,0,
               (MFInfo *)&firstChars,(FabFactory<amrex::FArrayBox> *)local_578);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&firstChars.field_2);
    pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
              (&pltData,(this->super_NavierStokesBase).super_AmrLevel.level,
               &(this->super_NavierStokesBase).super_AmrLevel.geom,(int)uVar50,0,3,&speciesPlt);
    amrex::MultiFab::Add
              ((MultiFab *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&speciesPlt,0,0,3,0);
    if (NavierStokesBase::verbose != 0) {
      poVar19 = amrex::OutStream();
      amrex::Print::Print((Print *)&firstChars,poVar19);
      std::operator<<((ostream *)firstChars.field_2._M_local_buf,
                      "initData: finished init from peleLM.initVelocityPlt");
      std::operator<<((ostream *)firstChars.field_2._M_local_buf,'\n');
      amrex::Print::~Print((Print *)&firstChars);
    }
    amrex::MultiFab::~MultiFab(&speciesPlt);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&names_1.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&plotnames_1.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    pele::physics::pltfilemanager::PltFileManager::~PltFileManager(&pltData);
  }
  NavierStokesBase::make_rho_prev_time(&this->super_NavierStokesBase);
  NavierStokesBase::make_rho_curr_time(&this->super_NavierStokesBase);
  initDataOtherTypes(this);
  NavierStokesBase::set_body_state
            (&this->super_NavierStokesBase,
             (MultiFab *)
             this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
  set_typical_values(this,false);
  init_mixture_fraction();
  initActiveControl(this);
  NavierStokesBase::InitialRedistribution(&this->super_NavierStokesBase);
  NavierStokesBase::set_body_state
            (&this->super_NavierStokesBase,
             (MultiFab *)
             this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
  if (NavierStokesBase::have_divu != 0) {
    RVar59 = amrex::StateData::curTime
                       ((this->super_NavierStokesBase).super_AmrLevel.state.
                        super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        _M_impl.super__Vector_impl_data._M_start + NavierStokesBase::Divu_Type);
    this_02 = (this->super_NavierStokesBase).super_AmrLevel.state.
              super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
              super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar5 = this_02[NavierStokesBase::Divu_Type].new_data._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    amrex::StateData::setTimeLevel(this_02,RVar59,1.0,1.0);
    amrex::AmrLevel::FillPatch
              ((AmrLevel *)this,
               (MultiFab *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
               ((IntVect *)
               ((long)this_00.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->vect
               [0],RVar59,0,3,NavierStokesBase::NUM_STATE + -4,3);
    (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x2f])(RVar59,this);
    (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x2d])
              (RVar59,0xbff0000000000000,this,pMVar5);
  }
  amrex::BoxArray::operator=
            (&(this->super_NavierStokesBase).old_intersect_new,
             &(this->super_NavierStokesBase).super_AmrLevel.grids);
  std::__cxx11::string::~string((string *)&velocity_plotfile);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pp);
  return;
}

Assistant:

void
PeleLM::initData ()
{
  //
  // Copy problem parameters into device copy
  //
  Gpu::copy(Gpu::hostToDevice, prob_parm, prob_parm+1,
            prob_parm_d);

  //
  // Initialize the state and the pressure.
  //
  MultiFab&   S_new    = get_new_data(State_Type);
  MultiFab&   P_new    = get_new_data(Press_Type);

  // If the user provide an initDataPlt, fill the data from there.
  ParmParse pp("peleLM");
  if (pp.countval("initDataPlt") > 0) {

    //
    // This code has a few drawbacks.  It assumes that the physical
    // domain size of the current problem is the same as that of the
    // one that generated the pltfile.  It also assumes that the pltfile
    // has at least as many levels as does the current problem.  If
    // either of these are false this code is likely to core dump.
    //
    S_new.setVal(0.0);
    P_new.setVal(0.0);

    std::string pltfile;
    pp.query("initDataPlt", pltfile);
    if (verbose)
      amrex::Print() << "initData: reading data from: " << pltfile << '\n';

    // Use PelePhysics PltFileManager
    pele::physics::pltfilemanager::PltFileManager pltData(pltfile); 
    Vector<std::string>  plotnames   = pltData.getVariableList();

    // Find required data in pltfile
    Vector<std::string> names;
    pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(names);

    int idT = -1, idX = -1, idY = -1, nSpecPlt = 0;
    for (int i = 0; i < plotnames.size(); ++i)
    {
      std::string firstChars = plotnames[i].substr(0, 2);
      if (plotnames[i] == "temp")       idT = i;
      if (plotnames[i] == "x_velocity") idX = i;
      if (firstChars == "Y(")     nSpecPlt += 1;
      if (firstChars == "Y(" && idY < 0 ) {  // species might not be ordered in the order of the current mech.
        idY = i;
      }
    }
    //
    // In the plotfile the mass fractions directly follow the velocities.
    //
    int idSpec = idX + AMREX_SPACEDIM;
 
    // Velocity
    pltData.fillPatchFromPlt(level, geom, idX, Xvel, AMREX_SPACEDIM,
                             S_new);

    // Temperature
    pltData.fillPatchFromPlt(level, geom, idT, Temp, 1,
                             S_new);

    // Species
    // Hold the species in temporary MF before copying to level data
    // in case the number of species differs.
    MultiFab speciesPlt(grids, dmap, nSpecPlt, 0); 
    pltData.fillPatchFromPlt(level, geom, idSpec, 0, nSpecPlt,
                             speciesPlt);
    for (int i = 0; i < NUM_SPECIES; i++) {
       std::string specString = "Y("+spec_names[i]+")";
       int foundSpec = 0;
       for (int iplt = 0; iplt < nSpecPlt; iplt++) {
          if ( specString == plotnames[idY+iplt] ) {
             MultiFab::Copy(S_new, speciesPlt, iplt, DEF_first_spec+i, 1, 0);
             foundSpec = 1;
          }
       }
       if (!foundSpec) S_new.setVal(0.0,DEF_first_spec+i,1);
    }

    if (verbose) amrex::Print() << "initData: finished init from pltfile" << '\n';

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(S_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
      const Box& box = mfi.tilebox();
      auto const& snew_arr = S_new.array(mfi);
      ProbParm const* lprobparm = prob_parm_d;

      amrex::ParallelFor(box,
      [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
        amrex::Real massfrac[NUM_SPECIES] = {0.0};
        for (int n = 0; n < NUM_SPECIES; n++) {
          massfrac[n] = snew_arr(i,j,k,DEF_first_spec+n);
        }
        auto eos = pele::physics::PhysicsType::eos();

        amrex::Real rho_cgs, P_cgs;
        P_cgs = lprobparm->P_mean * 10.0;

        eos.PYT2R(P_cgs, massfrac, snew_arr(i,j,k,DEF_Temp), rho_cgs);
        snew_arr(i,j,k,Density) = rho_cgs * 1.0e3;            // CGS -> MKS conversion

        eos.TY2H(snew_arr(i,j,k,DEF_Temp), massfrac, snew_arr(i,j,k,DEF_RhoH));
        snew_arr(i,j,k,DEF_RhoH) = snew_arr(i,j,k,DEF_RhoH) * 1.0e-4 * snew_arr(i,j,k,Density);   // CGS -> MKS conversion

        for (int n = 0; n < NUM_SPECIES; n++) {
          snew_arr(i,j,k,DEF_first_spec+n) = massfrac[n] * snew_arr(i,j,k,Density);
        }
      });
    }
  }
  else {
    const auto geomdata = geom.data();
    S_new.setVal(0.0);
    P_new.setVal(0.0);

    ProbParm const* lprobparm = prob_parm_d;
    pele::physics::PMF::PmfData::DataContainer const* lpmfdata = pmf_data.getDeviceData();

    auto const& sma = S_new.arrays();
    amrex::ParallelFor(S_new,
    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
    {
       pelelm_initdata(i, j, k, sma[box_no], geomdata, *lprobparm, lpmfdata);
    });
  }

  showMFsub("1D",S_new,stripBox,"1D_S",level);

  //
  // Initialize GradP
  //
  computeGradP(state[Press_Type].curTime());

  //
  // We might want to add the velocity from the supplied plotfile
  // to what we already put into the velocity field via init_data
  //
  std::string velocity_plotfile;
  pp.query("initVelocityPlt", velocity_plotfile);

  if (!velocity_plotfile.empty()) {
    if (verbose)
      amrex::Print() << "initData: reading velocity from: " << velocity_plotfile << '\n';

    // Use PelePhysics PltFileManager
    pele::physics::pltfilemanager::PltFileManager pltData(velocity_plotfile); 
    Vector<std::string>  plotnames   = pltData.getVariableList();

    // Find required data in pltfile
    Vector<std::string> names;
    pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(names);

    int idX = -1;
    for (int i = 0; i < plotnames.size(); ++i)
    {
      if (plotnames[i] == "x_velocity") idX = i;
    }
    if (idX == -1)
      amrex::Abort("Could not find velocity fields in supplied peleLM.initVelocityPlt");
 
    MultiFab tmp(S_new.boxArray(), S_new.DistributionMap(), 1, 0);

    // Velocity
    pltData.fillPatchFromPlt(level, geom, idX, 0, AMREX_SPACEDIM,
                             tmp);
    MultiFab::Add(S_new,tmp,0,Xvel,AMREX_SPACEDIM,0);

    if (verbose)
      amrex::Print() << "initData: finished init from peleLM.initVelocityPlt" << '\n';
  }

  make_rho_prev_time();
  make_rho_curr_time();

  //
  // Initialize other types (RhoRT, divu, ...)
  //
  initDataOtherTypes();

  // Initialize state for EB covered regions.
#ifdef AMREX_USE_EB
  set_body_state(S_new);
#endif

  //
  // Load typical values for each state component
  //
  set_typical_values(false);

  //
  // Initialize mixture fraction data.
  //
  init_mixture_fraction();

  //
  // Initialize active control
  //
  initActiveControl();

#ifdef AMREX_USE_EB
  //
  // Perform redistribution on initial fields
  // This changes the input velocity fields
  //
  InitialRedistribution();
  set_body_state(S_new);
#endif

  //
  // Initialize divU
  //
  if (have_divu)
  {
    const Real dt       = 1.0;
    const Real dtin     = -1.0; // Dummy value denotes initialization.
    const Real new_time = state[Divu_Type].curTime();
    MultiFab&  Divu_new = get_new_data(Divu_Type);

    state[State_Type].setTimeLevel(new_time, dt, dt);

    // calcDiff uses class state and assumes FillPatched -> do it now
    FillPatch(*this, S_new, S_new.nGrow(), new_time , State_Type, Density, NUM_STATE-(Density+1), Density);
    calcDiffusivity(new_time);

    calc_divu(new_time, dtin, Divu_new);
  }

  old_intersect_new = grids;

#ifdef AMREX_PARTICLES
  NavierStokesBase::initParticleData();
#endif
}